

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

Addr * __thiscall hwnet::TCPSocket::LocalAddr(TCPSocket *this)

{
  bool bVar1;
  int iVar2;
  sockaddr *psVar3;
  Addr local_a0;
  socklen_t local_28 [2];
  socklen_t len;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  TCPSocket *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx);
  bVar1 = Addr::IsVaild(&this->localAddr);
  if (!bVar1) {
    local_28[0] = 0x78;
    iVar2 = this->fd;
    psVar3 = Addr::Address(&this->localAddr);
    iVar2 = getsockname(iVar2,(sockaddr *)psVar3,local_28);
    if (iVar2 == 0) {
      psVar3 = Addr::Address(&this->localAddr);
      Addr::MakeBySockAddr(&local_a0,psVar3,local_28[0]);
      memcpy(&this->localAddr,&local_a0,0x78);
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return &this->localAddr;
}

Assistant:

const Addr& TCPSocket::LocalAddr() const {
	std::lock_guard<std::mutex> guard(this->mtx);	
	if(!this->localAddr.IsVaild()) {
		socklen_t len = sizeof(this->localAddr);
		if(0 == ::getsockname(this->fd,this->localAddr.Address(),&len)) {
			this->localAddr = Addr::MakeBySockAddr(this->localAddr.Address(),len);
		}		
	}
	return this->localAddr;	
}